

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::GenerateEnum(EnumDescriptor *en,Printer *printer)

{
  int iVar1;
  Printer *this;
  int iVar2;
  uint uVar3;
  string *psVar4;
  int32 value_00;
  string local_48;
  EnumValueDescriptor *local_28;
  EnumValueDescriptor *value;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  EnumDescriptor *en_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)en;
  psVar4 = EnumDescriptor::full_name_abi_cxx11_(en);
  io::Printer::Print(printer,"add_enum \"$name$\" do\n","name",psVar4);
  io::Printer::Indent(pPStack_18);
  value._4_4_ = 0;
  while( true ) {
    iVar1 = value._4_4_;
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)printer_local);
    if (iVar2 <= iVar1) break;
    local_28 = EnumDescriptor::value((EnumDescriptor *)printer_local,value._4_4_);
    this = pPStack_18;
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_28);
    uVar3 = EnumValueDescriptor::number(local_28);
    IntToString_abi_cxx11_(&local_48,(ruby *)(ulong)uVar3,value_00);
    io::Printer::Print(this,"value :$name$, $number$\n","name",psVar4,"number",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    value._4_4_ = value._4_4_ + 1;
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"end\n");
  return;
}

Assistant:

void GenerateEnum(const google::protobuf::EnumDescriptor* en,
                  google::protobuf::io::Printer* printer) {
  printer->Print(
    "add_enum \"$name$\" do\n",
    "name", en->full_name());
  printer->Indent();

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
      "value :$name$, $number$\n",
      "name", value->name(),
      "number", IntToString(value->number()));
  }

  printer->Outdent();
  printer->Print(
    "end\n");
}